

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O2

void __thiscall Reducer::applyTestToWorking(Reducer *this)

{
  size_t __val;
  string *__lhs;
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  std::__cxx11::string::string(local_d8,(string *)&this->test);
  __lhs = &this->working;
  std::__cxx11::string::string(local_98,(string *)__lhs);
  wasm::copy_file(local_d8,local_98);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_d8);
  if (saveAllWorkingFiles == '\x01') {
    std::__cxx11::string::string(local_b8,(string *)__lhs);
    std::operator+(&local_58,__lhs,'.');
    __val = workingFileIndex;
    workingFileIndex = workingFileIndex + 1;
    std::__cxx11::to_string(&local_38,__val);
    std::operator+(&local_78,&local_58,&local_38);
    wasm::copy_file(local_b8,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string(local_b8);
  }
  return;
}

Assistant:

void applyTestToWorking() {
    copy_file(test, working);

    if (saveAllWorkingFiles) {
      copy_file(working, working + '.' + std::to_string(workingFileIndex++));
    }
  }